

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

uint __thiscall CVmHashFuncCS::compute_hash(CVmHashFuncCS *this,char *s,size_t l)

{
  uchar c;
  uint acc;
  size_t l_local;
  char *s_local;
  CVmHashFuncCS *this_local;
  
  acc = 0;
  s_local = s;
  for (l_local = l; l_local != 0; l_local = l_local - 1) {
    acc = (byte)*s_local + acc;
    s_local = s_local + 1;
  }
  return acc;
}

Assistant:

unsigned int CVmHashFuncCS::compute_hash(const char *s, size_t l) const
{
    uint acc;

    /*
     *   add up all the character values in the string, treating case as
     *   significant 
     */
    for (acc = 0 ; l != 0 ; ++s, --l)
    {
        uchar c;

        c = (uchar)*s;
        acc += c;
    }

    /* return the accumulated value */
    return acc;
}